

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall Catch::TAPReporter::testRunStarting(TAPReporter *this,TestRunInfo *param_1)

{
  int iVar1;
  undefined8 in_RAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar2;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  iVar1 = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config)->
            _vptr_IConfig[0xd])();
  if (*(long *)CONCAT44(extraout_var,iVar1) != ((long *)CONCAT44(extraout_var,iVar1))[1]) {
    poVar2 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"# filters: ",0xb);
    iVar1 = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config)
              ->_vptr_IConfig[0xd])();
    TestSpec::serializeTo((TestSpec *)CONCAT44(extraout_var_00,iVar1),poVar2);
    uStack_18._0_7_ = CONCAT16(10,(undefined6)uStack_18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)((long)&uStack_18 + 6),1);
  }
  poVar2 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"# rng-seed: ",0xc);
  (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config)->
    _vptr_IConfig[0x11])();
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  uStack_18 = CONCAT17(10,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)((long)&uStack_18 + 7),1);
  return;
}

Assistant:

void TAPReporter::testRunStarting( TestRunInfo const& ) {
        if ( m_config->testSpec().hasFilters() ) {
            m_stream << "# filters: " << m_config->testSpec() << '\n';
        }
        m_stream << "# rng-seed: " << m_config->rngSeed() << '\n';
    }